

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[9],pstack::Dwarf::UnitType,char>
          (JObject *this,char (*k) [9],UnitType *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[9],_pstack::Dwarf::UnitType>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[9],_pstack::Dwarf::UnitType> field;
  char *c_local;
  UnitType *v_local;
  char (*k_local) [9];
  JObject *this_local;
  
  field.v = (UnitType *)c;
  Field<char[9],_pstack::Dwarf::UnitType>::Field
            ((Field<char[9],_pstack::Dwarf::UnitType> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[9],pstack::Dwarf::UnitType>,char>
                       ((Field<char[9],_pstack::Dwarf::UnitType> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }